

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,false>
               (timestamp_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  timestamp_t tVar2;
  ulong uVar3;
  timestamp_t *extraout_RDX;
  timestamp_t *extraout_RDX_00;
  timestamp_t *ptVar4;
  timestamp_t *extraout_RDX_01;
  int64_t *piVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  interval_t interval;
  interval_t interval_00;
  interval_t iVar11;
  int64_t *local_78;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &rdata->micros;
      iVar6 = 0;
      ptVar4 = result_data;
      do {
        tVar2.value = ldata[iVar6].value;
        iVar11.micros = (int64_t)ptVar4;
        iVar11._0_8_ = *local_78;
        iVar11 = Interval::Invert(*(Interval **)(local_78 + -1),iVar11);
        tVar2 = Interval::Add(tVar2,iVar11);
        result_data[iVar6].value = tVar2.value;
        iVar6 = iVar6 + 1;
        local_78 = local_78 + 2;
        ptVar4 = extraout_RDX_01;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar3 = 0;
    ptVar4 = result_data;
    uVar7 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar1[uVar3];
      }
      uVar9 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar9 = count;
      }
      uVar8 = uVar9;
      if (uVar10 != 0) {
        uVar8 = uVar7;
        if (uVar10 == 0xffffffffffffffff) {
          if (uVar7 < uVar9) {
            piVar5 = &rdata[uVar7].micros;
            do {
              tVar2.value = ldata[uVar8].value;
              interval.micros = (int64_t)ptVar4;
              interval._0_8_ = *piVar5;
              iVar11 = Interval::Invert(*(Interval **)(piVar5 + -1),interval);
              tVar2 = Interval::Add(tVar2,iVar11);
              result_data[uVar8].value = tVar2.value;
              uVar8 = uVar8 + 1;
              piVar5 = piVar5 + 2;
              ptVar4 = extraout_RDX;
            } while (uVar9 != uVar8);
          }
        }
        else if (uVar7 < uVar9) {
          piVar5 = &rdata[uVar7].micros;
          uVar8 = 0;
          do {
            if ((uVar10 >> (uVar8 & 0x3f) & 1) != 0) {
              tVar2.value = ldata[uVar7 + uVar8].value;
              interval_00.micros = (int64_t)ptVar4;
              interval_00._0_8_ = *piVar5;
              iVar11 = Interval::Invert(*(Interval **)(piVar5 + -1),interval_00);
              tVar2 = Interval::Add(tVar2,iVar11);
              result_data[uVar7 + uVar8].value = tVar2.value;
              ptVar4 = extraout_RDX_00;
            }
            uVar8 = uVar8 + 1;
            piVar5 = piVar5 + 2;
          } while ((uVar7 - uVar9) + uVar8 != 0);
          uVar8 = uVar7 + uVar8;
        }
      }
      uVar3 = uVar3 + 1;
      uVar7 = uVar8;
    } while (uVar3 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}